

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall FakeTokenCommandRunner::~FakeTokenCommandRunner(FakeTokenCommandRunner *this)

{
  FakeTokenCommandRunner *this_local;
  
  (this->super_CommandRunner)._vptr_CommandRunner =
       (_func_int **)&PTR__FakeTokenCommandRunner_002a3238;
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->wait_for_command_);
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->can_run_more_);
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->acquire_token_);
  std::vector<Edge_*,_std::allocator<Edge_*>_>::~vector(&this->edges_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->commands_ran_);
  CommandRunner::~CommandRunner(&this->super_CommandRunner);
  return;
}

Assistant:

explicit FakeTokenCommandRunner() {}